

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtContextCore.cpp
# Opt level: O1

bool __thiscall
ChakraCoreHostScriptContext::ReportModuleCompletion
          (ChakraCoreHostScriptContext *this,ModuleRecordBase *module,Var exception)

{
  JsErrorCode JVar1;
  bool bVar2;
  AutoFilterExceptionRegion local_24 [2];
  AutoFilterExceptionRegion __autoFilterExceptionRegion;
  
  if (this->reportModuleCompletionCallback == (ReportModuleCompletionCallback)0x0) {
    bVar2 = false;
  }
  else {
    AutoFilterExceptionRegion::AutoFilterExceptionRegion(local_24,ExceptionType_All);
    JVar1 = (*this->reportModuleCompletionCallback)(module,exception);
    bVar2 = JVar1 == JsNoError;
    AutoFilterExceptionRegion::~AutoFilterExceptionRegion(local_24);
  }
  return bVar2;
}

Assistant:

bool ChakraCoreHostScriptContext::ReportModuleCompletion(Js::ModuleRecordBase* module, Js::Var exception)
{
    if (reportModuleCompletionCallback == nullptr)
    {
        return false;
    }
    {
        AUTO_NO_EXCEPTION_REGION;
        JsErrorCode errorCode = reportModuleCompletionCallback(module, exception);
        if (errorCode == JsNoError)
        {
            return true;
        }
    }
    return false;
}